

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testlab11.c
# Opt level: O0

int FeedFromArray(void)

{
  ulong local_18;
  size_t i;
  
  stream.In = (FILE *)fopen("in.txt","w+");
  if ((FILE *)stream.In == (FILE *)0x0) {
    printf("can\'t create in.txt. No space on disk?\n");
    i._4_4_ = -1;
  }
  else {
    fprintf((FILE *)stream.In,"%lu %d\n",TestData.Tests[currentTest].CountItems,
            (ulong)(uint)TestData.Tests[currentTest].MaxKnapsackWeight);
    for (local_18 = 0; local_18 < TestData.Tests[currentTest].CountItems; local_18 = local_18 + 1) {
      fprintf((FILE *)stream.In,"%d %d\n",
              (ulong)(uint)TestData.Tests[currentTest].Items[local_18].Weight,
              (ulong)*(uint *)(currentTest * 0x478 + 0x10610c + local_18 * 8));
    }
    fclose((FILE *)stream.In);
    i._4_4_ = 0;
  }
  return i._4_4_;
}

Assistant:

static int FeedFromArray(void) {
    stream.In = fopen("in.txt", "w+");
    if (!stream.In) {
        printf("can't create in.txt. No space on disk?\n");
        return -1;
    }
    fprintf(stream.In, "%lu %d\n", TestData.Tests[currentTest].CountItems, TestData.Tests[currentTest].MaxKnapsackWeight);
    for (size_t i = 0; i < TestData.Tests[currentTest].CountItems; ++i) {
        fprintf(stream.In, "%d %d\n", TestData.Tests[currentTest].Items[i].Weight, TestData.Tests[currentTest].Items[i].Cost);
    }
    fclose(stream.In);
    return 0;
}